

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint addChunk_pHYs(ucvector *out,LodePNGInfo *info)

{
  uint uVar1;
  uint uVar2;
  uchar *in_RAX;
  uchar *chunk;
  uchar *local_18;
  
  local_18 = in_RAX;
  uVar2 = lodepng_chunk_init(&local_18,out,9,"pHYs");
  if (uVar2 == 0) {
    uVar1 = info->phys_x;
    *(uint *)(local_18 + 8) =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    uVar1 = info->phys_y;
    *(uint *)(local_18 + 0xc) =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    local_18[0x10] = (uchar)info->phys_unit;
    lodepng_chunk_generate_crc(local_18);
  }
  return uVar2;
}

Assistant:

static unsigned addChunk_pHYs(ucvector* out, const LodePNGInfo* info) {
  unsigned char* chunk;
  CERROR_TRY_RETURN(lodepng_chunk_init(&chunk, out, 9, "pHYs"));
  lodepng_set32bitInt(chunk + 8, info->phys_x);
  lodepng_set32bitInt(chunk + 12, info->phys_y);
  chunk[16] = info->phys_unit;
  lodepng_chunk_generate_crc(chunk);
  return 0;
}